

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,UInt value)

{
  uint uVar1;
  byte *pbVar3;
  char buffer [32];
  allocator local_29;
  byte local_28 [30];
  byte local_a [2];
  ulong uVar2;
  
  pbVar3 = local_a + 1;
  local_a[1] = 0;
  uVar2 = (ulong)this & 0xffffffff;
  do {
    uVar1 = (uint)uVar2;
    pbVar3[-1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    pbVar3 = pbVar3 + -1;
    uVar2 = uVar2 / 10;
  } while (9 < uVar1);
  if (local_28 <= pbVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pbVar3,&local_29);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                ,0x53,"std::string Json::valueToString(UInt)");
}

Assistant:

std::string valueToString ( UInt value )
{
    char buffer[32];
    char* current = buffer + sizeof (buffer);
    uintToString ( value, current );
    assert ( current >= buffer );
    return current;
}